

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,Version *version)

{
  ostream *poVar1;
  Version *version_local;
  ostream *os_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(os,version->majorVersion);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,version->minorVersion);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::operator<<(poVar1,version->patchNumber);
  if (*version->branchName != '\0') {
    poVar1 = std::operator<<(os,'-');
    poVar1 = std::operator<<(poVar1,version->branchName);
    poVar1 = std::operator<<(poVar1,'.');
    std::ostream::operator<<(poVar1,version->buildNumber);
  }
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, Version const& version ) {
        os  << version.majorVersion << '.'
            << version.minorVersion << '.'
            << version.patchNumber;
        // branchName is never null -> 0th char is \0 if it is empty
        if (version.branchName[0]) {
            os << '-' << version.branchName
               << '.' << version.buildNumber;
        }
        return os;
    }